

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void hash_table_increase_buckets(hash_table_t *table)

{
  uint uVar1;
  hash_table_bucket_t *phVar2;
  hash_table_bucket_t *phVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  undefined8 *puVar8;
  hash_table_bucket_t *phVar9;
  universal_hash_function_t local_48;
  
  uVar1 = table->n_buckets;
  if (uVar1 == 0) {
    __assert_fail("table->n_buckets > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/util.c"
                  ,0xfe,"void hash_table_increase_buckets(hash_table_t *)");
  }
  phVar3 = (hash_table_bucket_t *)calloc((ulong)(uVar1 * 2 + 1),0x10);
  if (phVar3 != (hash_table_bucket_t *)0x0) {
    phVar3->next = table->allocs;
    table->allocs = phVar3;
    new_universal_hash_function(&local_48,&table->seed,uVar1 * 2);
    for (uVar6 = 0; uVar6 < table->n_buckets; uVar6 = uVar6 + 1) {
      phVar9 = table->buckets[uVar6].next;
      while (phVar9 != (hash_table_bucket_t *)0x0) {
        phVar2 = phVar9->next;
        sVar4 = (*table->hash)(phVar9->data);
        uVar5 = sVar4 * local_48.mult + local_48.add >> (0x40U - (char)local_48.log2_buckets & 0x3f)
                & 0xffffffff;
        phVar9->next = phVar3[uVar5 + 1].next;
        phVar3[uVar5 + 1].next = phVar9;
        phVar9 = phVar2;
      }
    }
    uVar6 = (ulong)(table->n_buckets - 1);
    for (lVar7 = 0; uVar6 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
      puVar8 = (undefined8 *)((long)&table->buckets->data + lVar7);
      puVar8[1] = puVar8 + 2;
      *puVar8 = 0;
    }
    phVar9 = table->buckets;
    phVar9[uVar6].next = table->free_buckets;
    phVar9[uVar6].data = (void *)0x0;
    table->free_buckets = phVar9;
    table->buckets = phVar3 + 1;
    table->n_buckets = uVar1 * 2;
    (table->ghash).mult = local_48.mult;
    (table->ghash).add = local_48.add;
    (table->ghash).log2_buckets = local_48.log2_buckets;
    *(undefined4 *)&(table->ghash).field_0x14 = local_48._20_4_;
    return;
  }
  fwrite("hash_table_increase_buckets: insufficient memory\n",0x31,1,_stderr);
  abort();
}

Assistant:

static void hash_table_increase_buckets( hash_table_t * table )
{
    unsigned i, j, new_n_buckets ;
    hash_table_bucket_t * new_table ;
    universal_hash_function_t new_ghash;
    assert( table->n_buckets > 0 );
    
    new_table = calloc(table->n_buckets * 2 + 1, sizeof(hash_table_bucket_t));
    if (!new_table) {
        fprintf(stderr, "hash_table_increase_buckets: "
                "insufficient memory\n");
        abort();
    }
    new_table->next = table->allocs;
    table->allocs = new_table;
    new_table += 1;

    new_n_buckets = 2 * table->n_buckets;
    new_ghash = new_universal_hash_function(&table->seed, new_n_buckets);
    
    /* rehash existing items*/
    for ( i = 0; i < table->n_buckets ; ++i ) {
        hash_table_bucket_t * b = table->buckets[i].next;
        while (b) {
            hash_table_bucket_t * c = b->next;
            j = (unsigned) hash( new_ghash, (* table->hash )( b->data ) );
            
            b->next = new_table[j].next;
            new_table[j].next = b;

            b = c;
        }
    }

    /* return old buckets to free list */
    for ( i = 0; i < table->n_buckets - 1; ++i ) {
        table->buckets[i].next = &table->buckets[i+1];
        table->buckets[i].data = NULL;
    } 
    table->buckets[table->n_buckets-1].next = table->free_buckets;
    table->buckets[table->n_buckets-1].data = NULL;
    table->free_buckets = table->buckets;

    /* commit changes */
    table->buckets = new_table;
    table->n_buckets = new_n_buckets;
    table->ghash = new_ghash;
}